

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O0

void printOperand(MCInst *MI,SStream *O,m680x_info *info,cs_m680x_op *op)

{
  uint32_t uVar1;
  cs_struct *in_RCX;
  SStream *OS;
  uint uVar2;
  long in_RDX;
  SStream *in_RSI;
  long in_RDI;
  cs_m680x_op *in_stack_ffffffffffffffc8;
  m680x_info *in_stack_ffffffffffffffd0;
  
  OS = (SStream *)(ulong)(in_RCX->arch - CS_ARCH_ARM64);
  switch(OS) {
  case (SStream *)0x0:
    printRegName(in_RCX,OS,(uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    break;
  case (SStream *)0x1:
    if (*(int *)(*(long *)(in_RDI + 800) + 100) == 0) {
      SStream_concat(in_RSI,"#%d",(ulong)(uint)in_RCX->mode);
    }
    else {
      uVar1 = get_unsigned(in_RCX->mode,(uint)*(byte *)((long)&in_RCX->printer_info + 4));
      SStream_concat(in_RSI,"#%u",(ulong)uVar1);
    }
    break;
  case (SStream *)0x2:
    if (((ulong)in_RCX->printer_info & 0x10000) != 0) {
      SStream_concat(in_RSI,"[");
    }
    if (*(int *)&in_RCX->printer == 0) {
      if (*(char *)&in_RCX->printer_info == '\0') {
        if ((*(char *)((long)&in_RCX->printer_info + 1) != '\0') && (*(int *)(in_RDX + 0x10) == 9))
        {
          uVar2 = (uint)*(char *)((long)&in_RCX->printer_info + 1);
          if ((int)uVar2 < 1) {
            uVar2 = -uVar2;
          }
          SStream_concat(in_RSI,"%d",(ulong)uVar2);
        }
      }
      else if (in_RCX->mode == 0x13) {
        SStream_concat(in_RSI,"$%04X",(ulong)*(ushort *)((long)&in_RCX->printer + 6));
      }
      else {
        SStream_concat(in_RSI,"%d",(ulong)(uint)(int)*(short *)((long)&in_RCX->printer + 4));
      }
    }
    else {
      printRegName(in_RCX,OS,(uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    }
    if (((ulong)in_RCX->printer_info & 0x20000) == 0) {
      SStream_concat(in_RSI,",");
    }
    printIncDec(SUB81((ulong)in_RCX >> 0x38,0),OS,in_stack_ffffffffffffffd0,
                in_stack_ffffffffffffffc8);
    printRegName(in_RCX,OS,(uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    if ((in_RCX->mode == 0x13) && (*(char *)&in_RCX->printer_info != '\0')) {
      SStream_concat(in_RSI,"R");
    }
    printIncDec(SUB81((ulong)in_RCX >> 0x38,0),OS,in_stack_ffffffffffffffd0,
                in_stack_ffffffffffffffc8);
    if (((ulong)in_RCX->printer_info & 0x10000) != 0) {
      SStream_concat(in_RSI,"]");
    }
    break;
  case (SStream *)0x3:
    if ((in_RCX->mode & 0x10000) == CS_MODE_ARM) {
      if ((ushort)(short)in_RCX->mode < CS_MODE_M680X_6811) {
        SStream_concat(in_RSI,">$%04X",(ulong)(ushort)(short)in_RCX->mode);
      }
      else {
        SStream_concat(in_RSI,"$%04X",(ulong)(ushort)(short)in_RCX->mode);
      }
    }
    else {
      SStream_concat(in_RSI,"[$%04X]",(ulong)(ushort)(short)in_RCX->mode);
    }
    break;
  case (SStream *)0x4:
    SStream_concat(in_RSI,"$%02X",(ulong)(byte)(char)in_RCX->mode);
    break;
  case (SStream *)0x5:
    SStream_concat(in_RSI,"$%04X",(ulong)(ushort)(short)in_RCX->mode);
    break;
  case (SStream *)0x6:
    SStream_concat(in_RSI,"%u",(ulong)(byte)(char)in_RCX->mode);
    break;
  default:
    SStream_concat(in_RSI,"<invalid_operand>");
  }
  return;
}

Assistant:

static void printOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op  = MCInst_getOperand(MI, OpNo);

	if (MCOperand_isReg(Op)) {
		unsigned int reg = MCOperand_getReg(Op);

		printRegName(O, reg);
		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.base = reg;
			} else {
#ifndef CAPSTONE_DIET
				uint8_t access[6];
#endif

				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].reg = reg;
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->csh->regsize_map[reg];

#ifndef CAPSTONE_DIET
				get_op_access(MI->csh, MCInst_getOpcode(MI), access, &MI->flat_insn->detail->x86.eflags);
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].access = access[MI->flat_insn->detail->x86.op_count];
#endif

				MI->flat_insn->detail->x86.op_count++;
			}
		}

		if (MI->op1_size == 0)
			MI->op1_size = MI->csh->regsize_map[reg];
	} else if (MCOperand_isImm(Op)) {
		uint8_t encsize;
		int64_t imm = MCOperand_getImm(Op);
		uint8_t opsize = X86_immediate_size(MCInst_getOpcode(MI), &encsize);

		if (opsize == 1)    // print 1 byte immediate in positive form
			imm = imm & 0xff;

		// printf(">>> id = %u\n", MI->flat_insn->id);
		switch(MI->flat_insn->id) {
			default:
				printImm(MI, O, imm, MI->csh->imm_unsigned);
				break;

			case X86_INS_MOVABS:
				// do not print number in negative form
				printImm(MI, O, imm, true);
				break;

			case X86_INS_IN:
			case X86_INS_OUT:
			case X86_INS_INT:
				// do not print number in negative form
				imm = imm & 0xff;
				printImm(MI, O, imm, true);
				break;

			case X86_INS_LCALL:
			case X86_INS_LJMP:
				// always print address in positive form
				if (OpNo == 1) {	// ptr16 part
					imm = imm & 0xffff;
					opsize = 2;
				}
				printImm(MI, O, imm, true);
				break;

			case X86_INS_AND:
			case X86_INS_OR:
			case X86_INS_XOR:
				// do not print number in negative form
				if (imm >= 0 && imm <= HEX_THRESHOLD)
					printImm(MI, O, imm, true);
				else {
					imm = arch_masks[opsize? opsize : MI->imm_size] & imm;
					printImm(MI, O, imm, true);
				}
				break;

			case X86_INS_RET:
			case X86_INS_RETF:
				// RET imm16
				if (imm >= 0 && imm <= HEX_THRESHOLD)
					printImm(MI, O, imm, true);
				else {
					imm = 0xffff & imm;
					printImm(MI, O, imm, true);
				}
				break;
		}

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = imm;
			} else {
#ifndef CAPSTONE_DIET
				uint8_t access[6];
#endif

				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_IMM;
				if (opsize > 0) {
					MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = opsize;
					MI->flat_insn->detail->x86.encoding.imm_size = encsize;
				} else if (MI->flat_insn->detail->x86.op_count > 0) {
					if (MI->flat_insn->id != X86_INS_LCALL && MI->flat_insn->id != X86_INS_LJMP) {
						MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size =
							MI->flat_insn->detail->x86.operands[0].size;
					} else
						MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->imm_size;
				} else
					MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->imm_size;
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].imm = imm;

#ifndef CAPSTONE_DIET
				get_op_access(MI->csh, MCInst_getOpcode(MI), access, &MI->flat_insn->detail->x86.eflags);
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].access = access[MI->flat_insn->detail->x86.op_count];
#endif

				MI->flat_insn->detail->x86.op_count++;
			}
		}
	}
}